

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

void ra_append_copy(roaring_array_t *ra,roaring_array_t *sa,uint16_t index,_Bool copy_on_write)

{
  int iVar1;
  container_t *pcVar2;
  undefined7 in_register_00000009;
  undefined6 in_register_00000012;
  ulong uVar3;
  ulong uVar4;
  
  extend_array(ra,1);
  iVar1 = ra->size;
  uVar4 = CONCAT62(in_register_00000012,index) & 0xffffffff;
  ra->keys[iVar1] = sa->keys[uVar4];
  if ((int)CONCAT71(in_register_00000009,copy_on_write) == 0) {
    pcVar2 = container_clone(sa->containers[uVar4],sa->typecodes[uVar4]);
  }
  else {
    pcVar2 = get_copy_of_container(sa->containers[uVar4],sa->typecodes + uVar4,true);
    uVar3 = (ulong)(uint)((int)CONCAT62(in_register_00000012,index) * 8);
    *(container_t **)((long)sa->containers + uVar3) = pcVar2;
    pcVar2 = *(container_t **)((long)sa->containers + uVar3);
  }
  ra->containers[iVar1] = pcVar2;
  ra->typecodes[iVar1] = sa->typecodes[uVar4];
  ra->size = ra->size + 1;
  return;
}

Assistant:

void ra_append_copy(roaring_array_t *ra, const roaring_array_t *sa,
                    uint16_t index, bool copy_on_write) {
    extend_array(ra, 1);
    const int32_t pos = ra->size;

    // old contents is junk not needing freeing
    ra->keys[pos] = sa->keys[index];
    // the shared container will be in two bitmaps
    if (copy_on_write) {
        sa->containers[index] = get_copy_of_container(
            sa->containers[index], &sa->typecodes[index], copy_on_write);
        ra->containers[pos] = sa->containers[index];
        ra->typecodes[pos] = sa->typecodes[index];
    } else {
        ra->containers[pos] =
            container_clone(sa->containers[index], sa->typecodes[index]);
        ra->typecodes[pos] = sa->typecodes[index];
    }
    ra->size++;
}